

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_list(Curl_easy *data)

{
  IMAP *pIVar1;
  char *local_50;
  char *local_48;
  char *mailbox;
  IMAP *imap;
  CURLcode result;
  Curl_easy *data_local;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1->custom == (char *)0x0) {
    if (pIVar1->mailbox == (char *)0x0) {
      local_50 = (*Curl_cstrdup)("");
    }
    else {
      local_50 = imap_atom(pIVar1->mailbox,true);
    }
    if (local_50 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    imap._4_4_ = imap_sendf(data,"LIST \"%s\" *",local_50);
    (*Curl_cfree)(local_50);
  }
  else {
    if (pIVar1->custom_params == (char *)0x0) {
      local_48 = "";
    }
    else {
      local_48 = pIVar1->custom_params;
    }
    imap._4_4_ = imap_sendf(data,"%s%s",pIVar1->custom,local_48);
  }
  if (imap._4_4_ == CURLE_OK) {
    imap_state(data,IMAP_LIST);
  }
  return imap._4_4_;
}

Assistant:

static CURLcode imap_perform_list(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;

  if(imap->custom)
    /* Send the custom request */
    result = imap_sendf(data, "%s%s", imap->custom,
                        imap->custom_params ? imap->custom_params : "");
  else {
    /* Make sure the mailbox is in the correct atom format if necessary */
    char *mailbox = imap->mailbox ? imap_atom(imap->mailbox, TRUE)
                                  : strdup("");
    if(!mailbox)
      return CURLE_OUT_OF_MEMORY;

    /* Send the LIST command */
    result = imap_sendf(data, "LIST \"%s\" *", mailbox);

    free(mailbox);
  }

  if(!result)
    imap_state(data, IMAP_LIST);

  return result;
}